

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * ae_wcstofflags(wchar_t *s,unsigned_long *setp,unsigned_long *clrp)

{
  int iVar1;
  bool bVar2;
  wchar_t *local_50;
  wchar_t *failed;
  unsigned_long clear;
  unsigned_long set;
  flag *flag;
  wchar_t *end;
  wchar_t *start;
  unsigned_long *clrp_local;
  unsigned_long *setp_local;
  wchar_t *s_local;
  
  failed = (wchar_t *)0x0;
  clear = 0;
  local_50 = (wchar_t *)0x0;
  end = s;
  while( true ) {
    bVar2 = true;
    if ((*end != L'\t') && (bVar2 = true, *end != L' ')) {
      bVar2 = *end == L',';
    }
    if (!bVar2) break;
    end = end + 1;
  }
  do {
    if (*end == L'\0') {
      if (setp != (unsigned_long *)0x0) {
        *setp = clear;
      }
      if (clrp != (unsigned_long *)0x0) {
        *clrp = (unsigned_long)failed;
      }
      return local_50;
    }
    flag = (flag *)end;
    while( true ) {
      bVar2 = false;
      if (((*(int *)&flag->name != 0) && (bVar2 = false, *(int *)&flag->name != 9)) &&
         (bVar2 = false, *(int *)&flag->name != 0x20)) {
        bVar2 = *(int *)&flag->name != 0x2c;
      }
      if (!bVar2) break;
      flag = (flag *)((long)&flag->name + 4);
    }
    for (set = (unsigned_long)flags; *(long *)(set + 8) != 0; set = set + 0x20) {
      iVar1 = wmemcmp(end,*(wchar_t **)(set + 8),(long)flag - (long)end >> 2);
      if (iVar1 == 0) {
        failed = (wchar_t *)(*(ulong *)(set + 0x10) | (ulong)failed);
        clear = *(ulong *)(set + 0x18) | clear;
        break;
      }
      iVar1 = wmemcmp(end,(wchar_t *)(*(long *)(set + 8) + 8),(long)flag - (long)end >> 2);
      if (iVar1 == 0) {
        clear = *(ulong *)(set + 0x10) | clear;
        failed = (wchar_t *)(*(ulong *)(set + 0x18) | (ulong)failed);
        break;
      }
    }
    if ((*(long *)(set + 8) == 0) && (local_50 == (wchar_t *)0x0)) {
      local_50 = end;
    }
    end = (wchar_t *)flag;
    while( true ) {
      bVar2 = true;
      if ((*end != L'\t') && (bVar2 = true, *end != L' ')) {
        bVar2 = *end == L',';
      }
      if (!bVar2) break;
      end = end + 1;
    }
  } while( true );
}

Assistant:

static const wchar_t *
ae_wcstofflags(const wchar_t *s, unsigned long *setp, unsigned long *clrp)
{
	const wchar_t *start, *end;
	struct flag *flag;
	unsigned long set, clear;
	const wchar_t *failed;

	set = clear = 0;
	start = s;
	failed = NULL;
	/* Find start of first token. */
	while (*start == L'\t'  ||  *start == L' '  ||  *start == L',')
		start++;
	while (*start != L'\0') {
		/* Locate end of token. */
		end = start;
		while (*end != L'\0'  &&  *end != L'\t'  &&
		    *end != L' '  &&  *end != L',')
			end++;
		for (flag = flags; flag->wname != NULL; flag++) {
			if (wmemcmp(start, flag->wname, end - start) == 0) {
				/* Matched "noXXXX", so reverse the sense. */
				clear |= flag->set;
				set |= flag->clear;
				break;
			} else if (wmemcmp(start, flag->wname + 2, end - start)
			    == 0) {
				/* Matched "XXXX", so don't reverse. */
				set |= flag->set;
				clear |= flag->clear;
				break;
			}
		}
		/* Ignore unknown flag names. */
		if (flag->wname == NULL  &&  failed == NULL)
			failed = start;

		/* Find start of next token. */
		start = end;
		while (*start == L'\t'  ||  *start == L' '  ||  *start == L',')
			start++;

	}

	if (setp)
		*setp = set;
	if (clrp)
		*clrp = clear;

	/* Return location of first failure. */
	return (failed);
}